

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qipaddress.cpp
# Opt level: O3

void QIPAddressUtils::toString(QString *appendTo,IPv4Address address)

{
  QTypedArrayData<char16_t> *__old_val_2;
  char16_t *__old_val_3;
  QTypedArrayData<char16_t> *__old_val_8;
  char16_t *__old_val_9;
  char16_t *__old_val_1;
  longlong __old_val_7;
  qsizetype qVar1;
  QTypedArrayData<char16_t> *__old_val;
  long in_FS_OFFSET;
  QStringView zero;
  QStringView zero_00;
  QStringView zero_01;
  QStringView zero_02;
  QString local_248;
  QString local_228;
  undefined1 local_210 [16];
  qsizetype local_200;
  undefined1 local_1f8 [16];
  qsizetype local_1e8;
  undefined1 local_1e0 [24];
  char16_t local_1c8;
  Data *local_1c0;
  undefined1 local_1b8 [16];
  QStringBuilder<QStringBuilder<QString,_char16_t>,_QString> local_1a8;
  char16_t local_170;
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_char16_t>,_QString>,_char16_t>,_QString>
  local_168;
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_char16_t>,_QString>,_char16_t>,_QString>
  local_110;
  char16_t local_b8;
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_char16_t>,_QString>,_char16_t>,_QString>,_char16_t>,_QString>
  local_b0;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  qVar1 = 1;
  if (address < 0x1000000) {
    local_1a8.a.a.d.ptr = L"0";
    local_1a8.a.a.d.d = (Data *)0x0;
    local_1a8.a.a.d.size = 1;
  }
  else {
    zero.m_data = L"0";
    zero.m_size = 1;
    qulltoa((QString *)local_1f8,(ulong)(address >> 0x18),10,zero);
    local_1a8.a.a.d.ptr = (char16_t *)local_1f8._8_8_;
    local_1a8.a.a.d.d = (Data *)local_1f8._0_8_;
    local_1a8.a.a.d.size = local_1e8;
  }
  local_1f8 = (undefined1  [16])0x0;
  local_1e8 = 0;
  if ((address & 0xff0000) == 0) {
    local_1a8.b.d.d = (Data *)0x0;
    local_1a8.b.d.ptr = L"0";
  }
  else {
    zero_00.m_data = L"0";
    zero_00.m_size = 1;
    qulltoa((QString *)local_210,(ulong)(address >> 0x10) & 0xff,10,zero_00);
    local_1a8.b.d.d = (Data *)local_210._0_8_;
    local_1a8.b.d.ptr = (char16_t *)local_210._8_8_;
    qVar1 = local_200;
  }
  local_1c8 = L'.';
  local_210 = (undefined1  [16])0x0;
  local_200 = 0;
  local_1e0._0_8_ = (Data *)0x0;
  local_1e0._8_16_ = (undefined1  [16])0x0;
  local_1a8.a.b = L'.';
  local_1c0 = (Data *)0x0;
  local_1b8 = (undefined1  [16])0x0;
  local_170 = L'.';
  local_b0.a.a.a.a.b.d.d = local_1a8.b.d.d;
  local_b0.a.a.a.a.b.d.ptr = local_1a8.b.d.ptr;
  local_b0.a.a.b.d.d = (Data *)0x0;
  local_b0.a.a.b.d.size = 1;
  local_b0.a.a.b.d.ptr = L"0";
  local_b0.a.a.a.a.a.a.d.ptr = local_1a8.a.a.d.ptr;
  local_b0.a.a.a.a.b.d.size = qVar1;
  local_b0.a.a.a.a.a.a.d.d = local_1a8.a.a.d.d;
  local_b0.a.a.a.a.a.a.d.size = local_1a8.a.a.d.size;
  if ((address & 0xff00) != 0) {
    zero_01.m_data = L"0";
    zero_01.m_size = 1;
    local_1a8.b.d.size = qVar1;
    qulltoa(&local_228,(ulong)(address >> 8) & 0xff,10,zero_01);
    local_b0.a.a.a.a.b.d.d = local_1a8.b.d.d;
    local_b0.a.a.a.a.b.d.ptr = local_1a8.b.d.ptr;
    local_b0.a.a.b.d.d = local_228.d.d;
    local_b0.a.a.b.d.size = local_228.d.size;
    local_b0.a.a.b.d.ptr = local_228.d.ptr;
    local_b0.a.a.a.a.a.a.d.ptr = local_1a8.a.a.d.ptr;
    local_b0.a.a.a.a.b.d.size = local_1a8.b.d.size;
    local_b0.a.a.a.a.a.a.d.d = local_1a8.a.a.d.d;
    local_b0.a.a.a.a.a.a.d.size = local_1a8.a.a.d.size;
  }
  local_1a8.a.a.d.d = (Data *)0x0;
  local_1a8.a.a.d.ptr = (char16_t *)0x0;
  local_1a8.a.a.d.size = 0;
  local_1a8.b.d.d = (Data *)0x0;
  local_1a8.b.d.ptr = (char16_t *)0x0;
  local_1a8.b.d.size = 0;
  local_228.d.d = (Data *)0x0;
  local_228.d.ptr = (char16_t *)0x0;
  local_228.d.size = 0;
  local_168.a.a.a.a.d.d = (Data *)0x0;
  local_168.a.a.a.a.d.ptr = (char16_t *)0x0;
  local_168.a.a.a.a.d.size = 0;
  local_168.a.a.b.d.d = (Data *)0x0;
  local_168.a.a.b.d.ptr = (char16_t *)0x0;
  local_168.a.a.b.d.size = 0;
  local_168.b.d.d = (Data *)0x0;
  local_168.b.d.ptr = (char16_t *)0x0;
  local_168.b.d.size = 0;
  local_b8 = L'.';
  local_168.a.a.a.b = local_1a8.a.b;
  local_168.a.b = local_170;
  local_110.a.a.a.b = local_1a8.a.b;
  local_110.a.b = local_170;
  if ((address & 0xff) == 0) {
    local_b0.b.d.ptr = L"0";
    local_b0.b.d.d = (Data *)0x0;
    local_b0.b.d.size = 1;
  }
  else {
    zero_02.m_data = L"0";
    zero_02.m_size = 1;
    local_110.a.a.a.a.d.d = local_b0.a.a.a.a.a.a.d.d;
    local_110.a.a.a.a.d.ptr = local_b0.a.a.a.a.a.a.d.ptr;
    local_110.a.a.a.a.d.size = local_b0.a.a.a.a.a.a.d.size;
    local_110.a.a.b.d.d = local_b0.a.a.a.a.b.d.d;
    local_110.a.a.b.d.ptr = local_b0.a.a.a.a.b.d.ptr;
    local_110.a.a.b.d.size = local_b0.a.a.a.a.b.d.size;
    local_110.b.d.d = local_b0.a.a.b.d.d;
    local_110.b.d.ptr = local_b0.a.a.b.d.ptr;
    local_110.b.d.size = local_b0.a.a.b.d.size;
    qulltoa(&local_248,(ulong)(address & 0xff),10,zero_02);
    local_b0.a.a.a.a.b.d.d = local_110.a.a.b.d.d;
    local_b0.a.a.a.a.b.d.ptr = local_110.a.a.b.d.ptr;
    local_b0.a.a.b.d.d = local_110.b.d.d;
    local_b0.b.d.size = local_248.d.size;
    local_b0.a.a.b.d.size = local_110.b.d.size;
    local_b0.a.a.b.d.ptr = local_110.b.d.ptr;
    local_b0.a.a.a.a.a.a.d.ptr = local_110.a.a.a.a.d.ptr;
    local_b0.a.a.a.a.b.d.size = local_110.a.a.b.d.size;
    local_b0.a.a.a.a.a.a.d.d = local_110.a.a.a.a.d.d;
    local_b0.a.a.a.a.a.a.d.size = local_110.a.a.a.a.d.size;
    local_b0.b.d.d = local_248.d.d;
    local_b0.b.d.ptr = local_248.d.ptr;
  }
  local_110.a.a.a.a.d.d = (Data *)0x0;
  local_110.a.a.a.a.d.ptr = (char16_t *)0x0;
  local_110.a.a.a.a.d.size = 0;
  local_110.a.a.b.d.d = (Data *)0x0;
  local_110.a.a.b.d.ptr = (char16_t *)0x0;
  local_110.a.a.b.d.size = 0;
  local_110.b.d.d = (Data *)0x0;
  local_110.b.d.ptr = (char16_t *)0x0;
  local_110.b.d.size = 0;
  local_248.d.d = (Data *)0x0;
  local_248.d.ptr = (char16_t *)0x0;
  local_248.d.size = 0;
  local_b0.a.a.a.a.a.b = local_110.a.a.a.b;
  local_b0.a.a.a.b = local_110.a.b;
  local_b0.a.b = local_b8;
  ::operator+=(appendTo,&local_b0);
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_char16_t>,_QString>,_char16_t>,_QString>,_char16_t>,_QString>
  ::~QStringBuilder(&local_b0);
  if (&(local_248.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_248.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_248.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_248.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_248.d.d)->super_QArrayData,2,0x10);
    }
  }
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_char16_t>,_QString>,_char16_t>,_QString>
  ::~QStringBuilder(&local_110);
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_char16_t>,_QString>,_char16_t>,_QString>
  ::~QStringBuilder(&local_168);
  if (&(local_228.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_228.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_228.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_228.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_228.d.d)->super_QArrayData,2,0x10);
    }
  }
  QStringBuilder<QStringBuilder<QString,_char16_t>,_QString>::~QStringBuilder(&local_1a8);
  QStringBuilder<QStringBuilder<QString,_char16_t>,_QString>::~QStringBuilder
            ((QStringBuilder<QStringBuilder<QString,_char16_t>,_QString> *)local_1e0);
  if ((QArrayData *)local_210._0_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_210._0_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_210._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_210._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_210._0_8_,2,0x10);
    }
  }
  if ((QArrayData *)local_1f8._0_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_1f8._0_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_1f8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_1f8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_1f8._0_8_,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void toString(QString &appendTo, IPv4Address address)
{
    // reconstructing is easy
    // use the fast operator% that pre-calculates the size
    appendTo += number(address >> 24) % u'.'
                % number(address >> 16) % u'.'
                % number(address >> 8) % u'.'
                % number(address);
}